

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::compiler::Token::Builder::initStringLiteral
          (Builder *__return_storage_ptr__,Builder *this,uint size)

{
  uint uVar1;
  PointerBuilder local_30;
  uint local_14;
  Builder *pBStack_10;
  uint size_local;
  Builder *this_local;
  
  local_14 = size;
  pBStack_10 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Token::Which>
            (&this->_builder,uVar1,STRING_LITERAL);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_30,&this->_builder,uVar1);
  capnp::_::PointerHelpers<capnp::Text,_(capnp::Kind)1>::init
            ((PointerHelpers<capnp::Text,_(capnp::Kind)1> *)__return_storage_ptr__,
             (EVP_PKEY_CTX *)(ulong)local_14);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::Text::Builder Token::Builder::initStringLiteral(unsigned int size) {
  _builder.setDataField<Token::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Token::STRING_LITERAL);
  return ::capnp::_::PointerHelpers< ::capnp::Text>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), size);
}